

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_test.cpp
# Opt level: O2

void __thiscall unit_test::unit_test(unit_test *this,service *s)

{
  io_service *piVar1;
  url_dispatcher *puVar2;
  allocator local_39;
  string local_38;
  
  cppcms::application::application(&this->super_application,s);
  *(undefined ***)this = &PTR__unit_test_0010aab8;
  piVar1 = (io_service *)cppcms::service::get_io_service();
  booster::aio::deadline_timer::deadline_timer(&this->timer_,piVar1);
  (this->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar2 = (url_dispatcher *)cppcms::application::dispatcher();
  std::__cxx11::string::string((string *)&local_38,"/normal",&local_39);
  cppcms::url_dispatcher::assign<unit_test>(puVar2,&local_38,0x106b3e,(unit_test *)0x0);
  std::__cxx11::string::~string((string *)&local_38);
  puVar2 = (url_dispatcher *)cppcms::application::dispatcher();
  std::__cxx11::string::string((string *)&local_38,"/throws",&local_39);
  cppcms::url_dispatcher::assign<unit_test>(puVar2,&local_38,0x106b40,(unit_test *)0x0);
  std::__cxx11::string::~string((string *)&local_38);
  puVar2 = (url_dispatcher *)cppcms::application::dispatcher();
  std::__cxx11::string::string((string *)&local_38,"/delayed",&local_39);
  cppcms::url_dispatcher::assign<unit_test>(puVar2,&local_38,0x106b88,(unit_test *)0x0);
  std::__cxx11::string::~string((string *)&local_38);
  puVar2 = (url_dispatcher *)cppcms::application::dispatcher();
  std::__cxx11::string::string((string *)&local_38,"/delayed_with_response",&local_39);
  cppcms::url_dispatcher::assign<unit_test>(puVar2,&local_38,0x106c72,(unit_test *)0x0);
  std::__cxx11::string::~string((string *)&local_38);
  puVar2 = (url_dispatcher *)cppcms::application::dispatcher();
  std::__cxx11::string::string((string *)&local_38,"/delayed_twice",&local_39);
  cppcms::url_dispatcher::assign<unit_test>(puVar2,&local_38,0x106d5c,(unit_test *)0x0);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

unit_test(cppcms::service &s) : 
		cppcms::application(s),
		timer_(s.get_io_service())
	{
		dispatcher().assign("/normal",&unit_test::normal,this);
		dispatcher().assign("/throws",&unit_test::throws,this);
		dispatcher().assign("/delayed",&unit_test::delayed,this);
		dispatcher().assign("/delayed_with_response",&unit_test::delayed_with_response,this);
		dispatcher().assign("/delayed_twice",&unit_test::delayed_twice,this);
	}